

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O0

int bget_get_bin(bufsize size)

{
  int iVar1;
  int mid;
  int hi;
  int lo;
  bufsize size_local;
  
  lo = 0;
  hi = 0x13;
  iVar1 = lo;
  while (lo = iVar1, 1 < hi - lo) {
    iVar1 = lo + hi >> 1;
    if (size < bget_bin_size[iVar1]) {
      hi = iVar1 + -1;
      iVar1 = lo;
    }
  }
  return lo;
}

Assistant:

static int bget_get_bin(bufsize size) {
  // binary chop bins
  int lo = 0, hi = MAX_BGET_BINS - 1;

  KMP_DEBUG_ASSERT(size > 0);

  while ((hi - lo) > 1) {
    int mid = (lo + hi) >> 1;
    if (size < bget_bin_size[mid])
      hi = mid - 1;
    else
      lo = mid;
  }

  KMP_DEBUG_ASSERT((lo >= 0) && (lo < MAX_BGET_BINS));

  return lo;
}